

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

char * __thiscall AActor::GetTag(AActor *this,char *def)

{
  char *pcVar1;
  PClass *pPVar2;
  
  if (this->Tag == (FString *)0x0) {
    if (def == (char *)0x0) {
      pPVar2 = DObject::GetClass((DObject *)this);
      def = FName::NameData.NameArray[(pPVar2->super_PStruct).super_PNamedType.TypeName.Index].Text;
    }
  }
  else {
    def = this->Tag->Chars;
    if (*def == '$') {
      pcVar1 = FStringTable::operator()(&GStrings,def + 1);
      return pcVar1;
    }
  }
  return def;
}

Assistant:

const char *AActor::GetTag(const char *def) const
{
	if (Tag != NULL)
	{
		const char *tag = Tag->GetChars();
		if (tag[0] == '$')
		{
			return GStrings(tag + 1);
		}
		else
		{
			return tag;
		}
	}
	else if (def)
	{
		return def;
	}
	else
	{
		return GetClass()->TypeName.GetChars();
	}
}